

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_curv_edge_tangents(Omega_h *this,Mesh *mesh,LOs *curv_edge2edge)

{
  Int IVar1;
  void *extraout_RDX;
  Write<int> *this_00;
  Reals RVar2;
  Write<int> local_40;
  Write<int> local_30;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    this_00 = &local_30;
    Write<int>::Write(this_00,&curv_edge2edge->write_);
    get_curv_edge_tangents_dim<3>(this,mesh,(LOs *)this_00);
  }
  else {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x6f);
    }
    this_00 = &local_40;
    Write<int>::Write(this_00,&curv_edge2edge->write_);
    get_curv_edge_tangents_dim<2>(this,mesh,(LOs *)this_00);
  }
  Write<int>::~Write(this_00);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_curv_edge_tangents(Mesh* mesh, LOs curv_edge2edge) {
  if (mesh->dim() == 3)
    return get_curv_edge_tangents_dim<3>(mesh, curv_edge2edge);
  if (mesh->dim() == 2)
    return get_curv_edge_tangents_dim<2>(mesh, curv_edge2edge);
  OMEGA_H_NORETURN(Reals());
}